

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ILBDOperator.cpp
# Opt level: O2

void __thiscall
lts2::LBDOperator::updateRingCells
          (LBDOperator *this,IntegratingCell *cells,int numberOfCells,float detectorSize,
          float ringRadius,float omega,float phi)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  ulong uVar8;
  int iVar9;
  ulong uVar10;
  int iVar11;
  double *pdVar12;
  float fVar13;
  float fVar14;
  long lVar7;
  
  iVar1 = (this->_patchSize).width;
  iVar2 = (this->_patchSize).height;
  uVar8 = 0;
  uVar10 = (ulong)(uint)numberOfCells;
  if (numberOfCells < 1) {
    uVar10 = uVar8;
  }
  pdVar12 = &cells->scaleFactor;
  for (; uVar10 != uVar8; uVar8 = uVar8 + 1) {
    fVar13 = (float)(int)uVar8 * omega + phi;
    fVar14 = cosf(fVar13);
    fVar14 = fVar14 * ringRadius + (float)(iVar1 / 2);
    fVar13 = sinf(fVar13);
    fVar13 = fVar13 * ringRadius + (float)(iVar2 / 2);
    lVar5 = lrintf(fVar14 - detectorSize);
    lVar6 = lrintf(fVar14 + detectorSize);
    lVar7 = lrintf(fVar13 - detectorSize);
    iVar3 = (int)lVar7;
    lVar7 = lrintf(fVar13 + detectorSize);
    iVar11 = (int)lVar5;
    if (iVar11 < 1) {
      iVar11 = 0;
    }
    iVar9 = (this->_patchSize).width;
    iVar4 = (this->_patchSize).height;
    if ((int)lVar6 < iVar9) {
      iVar9 = (int)lVar6 + 1;
    }
    if (iVar3 < 1) {
      iVar3 = 0;
    }
    if ((int)lVar7 < iVar4) {
      iVar4 = (int)lVar7 + 1;
    }
    ((IntegratingCell *)(pdVar12 + -2))->xmin = iVar11;
    *(int *)((long)pdVar12 + -0xc) = iVar9;
    *(int *)(pdVar12 + -1) = iVar3;
    *(int *)((long)pdVar12 + -4) = iVar4;
    *pdVar12 = 1.0 / (double)((iVar4 - iVar3) * (iVar9 - iVar11));
    pdVar12 = pdVar12 + 3;
  }
  return;
}

Assistant:

void lts2::LBDOperator::updateRingCells(lbd::IntegratingCell* cells, int numberOfCells, float detectorSize, float ringRadius, float omega, float phi)
{
    float xoffset = _patchSize.width / 2;
    float yoffset = _patchSize.height / 2;
    
    for (int cellIdx = 0; cellIdx < numberOfCells; ++cellIdx)
    {
      lbd::IntegratingCell* currentCell = cells + cellIdx;
        
        float theta = cellIdx * omega + phi;
        
        float xc = xoffset + ringRadius * std::cos(theta);
        float yc = yoffset + ringRadius * std::sin(theta);
        
        int xmin =  (int)lrintf(xc-detectorSize);
        int xmax =  (int)lrintf(xc+detectorSize) + 1;
        int ymin =  (int)lrintf(yc-detectorSize);
        int ymax =  (int)lrintf(yc+detectorSize) + 1;
        
        xmin = MAX(xmin, 0);
        xmax = MIN(xmax, _patchSize.width);
        ymin = MAX(ymin, 0);
        ymax = MIN(ymax, _patchSize.height);
        
        currentCell->xmin = xmin;
        currentCell->xmax = xmax;
        currentCell->ymin = ymin;
        currentCell->ymax = ymax;
        
        double cellArea = double((xmax - xmin)*(ymax - ymin));
        currentCell->scaleFactor = 1.0 / cellArea;
    }
}